

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sound.cpp
# Opt level: O1

void XPMP2::SoundSystemXP::PlayCallback(void *inRefcon,FMOD_RESULT status)

{
  SoundSystem *this;
  SoundChannel *pSVar1;
  char *pcVar2;
  
  if (gpSndSys == 0) {
    this = (SoundSystem *)0x0;
  }
  else {
    this = (SoundSystem *)__dynamic_cast(gpSndSys,&SoundSystem::typeinfo,&typeinfo,0);
  }
  if (this != (SoundSystem *)0x0) {
    if (status != FMOD_OK) {
      pSVar1 = SoundSystem::GetChn(this,(uint64_t)inRefcon);
      if (glob < 4) {
        pcVar2 = "<NULL>";
        if ((pSVar1 != (SoundChannel *)0x0) && (pSVar1->pSnd != (SoundFile *)0x0)) {
          pcVar2 = (pSVar1->pSnd->filePath)._M_dataplus._M_p;
        }
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Sound.cpp"
               ,0x217,"PlayCallback",logERR,
               "XPLMPlayPCMOnBus for sound %lu/\'%s\' caused FMOD error %d",inRefcon,pcVar2,
               (ulong)status);
      }
    }
    SoundSystem::RemoveChn(this,(uint64_t)inRefcon);
    return;
  }
  if (glob < 4) {
    LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Sound.cpp"
           ,0x20c,"PlayCallback",logERR,"No XP Sound system in use!");
    return;
  }
  return;
}

Assistant:

void SoundSystemXP::PlayCallback (void*         inRefcon,
                                  FMOD_RESULT   status)
{
    // Sanity checks
    SoundSystemXP* me = dynamic_cast<SoundSystemXP*>(gpSndSys);
    if (!me) {
        LOG_MSG(logERR, "No XP Sound system in use!");
        return;
    }
    
    // Log any issue there might have been
    uint64_t sndId = uint64_t(inRefcon);
    if (status != FMOD_OK) {
        const SoundChannel* pChn = me->GetChn(sndId);
        LOG_MSG(logERR, "XPLMPlayPCMOnBus for sound %lu/'%s' caused FMOD error %d",
                (unsigned long)sndId,
                pChn && pChn->pSnd ? pChn->pSnd->filePath.c_str() : "<NULL>",
                status);
    }
    
    // Playback has ended, remove the sound channel entry
    me->RemoveChn(sndId);
}